

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O3

Abc_Ntk_t * Io_ReadBlifAsAig(char *pFileName,int fCheck)

{
  char cVar1;
  void *pvVar2;
  uint *puVar3;
  long *plVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  FILE *pFVar11;
  Io_BlifMan_t *p;
  Vec_Ptr_t *pVVar12;
  void **ppvVar13;
  long lVar14;
  char *pcVar15;
  Io_BlifObj_t *pIVar16;
  Io_BlifObj_t **ppIVar17;
  Vec_Ptr_t *pVVar18;
  ulong uVar19;
  Abc_Ntk_t *pAVar20;
  Abc_Obj_t *pAVar21;
  Abc_Obj_t *pObj;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar22;
  size_t sVar23;
  int i;
  int iVar24;
  byte *pbVar25;
  ulong uVar26;
  ulong uVar27;
  char *pcVar28;
  byte bVar29;
  long lVar30;
  byte *pbVar31;
  uint uVar32;
  
  pFVar11 = fopen(pFileName,"rb");
  if (pFVar11 == (FILE *)0x0) {
    puts("Io_Blif(): The file is unavailable (absent or open).");
    return (Abc_Ntk_t *)0x0;
  }
  fclose(pFVar11);
  p = (Io_BlifMan_t *)calloc(1,0x298);
  pVVar12 = (Vec_Ptr_t *)malloc(0x10);
  pVVar12->nCap = 0x200;
  pVVar12->nSize = 0;
  ppvVar13 = (void **)malloc(0x1000);
  pVVar12->pArray = ppvVar13;
  p->vLines = pVVar12;
  pVVar12 = (Vec_Ptr_t *)malloc(0x10);
  pVVar12->nCap = 0x200;
  pVVar12->nSize = 0;
  ppvVar13 = (void **)malloc(0x1000);
  pVVar12->pArray = ppvVar13;
  p->vInputs = pVVar12;
  pVVar12 = (Vec_Ptr_t *)malloc(0x10);
  pVVar12->nCap = 0x200;
  pVVar12->nSize = 0;
  ppvVar13 = (void **)malloc(0x1000);
  pVVar12->pArray = ppvVar13;
  p->vOutputs = pVVar12;
  pVVar12 = (Vec_Ptr_t *)malloc(0x10);
  pVVar12->nCap = 0x200;
  pVVar12->nSize = 0;
  ppvVar13 = (void **)malloc(0x1000);
  pVVar12->pArray = ppvVar13;
  p->vLatches = pVVar12;
  pVVar12 = (Vec_Ptr_t *)malloc(0x10);
  pVVar12->nCap = 0x200;
  pVVar12->nSize = 0;
  ppvVar13 = (void **)malloc(0x1000);
  pVVar12->pArray = ppvVar13;
  p->vNames = pVVar12;
  pVVar12 = (Vec_Ptr_t *)malloc(0x10);
  pVVar12->nCap = 0x200;
  pVVar12->nSize = 0;
  ppvVar13 = (void **)malloc(0x1000);
  pVVar12->pArray = ppvVar13;
  p->vTokens = pVVar12;
  pVVar12 = (Vec_Ptr_t *)malloc(0x10);
  pVVar12->nCap = 0x200;
  pVVar12->nSize = 0;
  ppvVar13 = (void **)malloc(0x1000);
  pVVar12->pArray = ppvVar13;
  p->vPis = pVVar12;
  pVVar12 = (Vec_Ptr_t *)malloc(0x10);
  pVVar12->nCap = 0x200;
  pVVar12->nSize = 0;
  ppvVar13 = (void **)malloc(0x1000);
  pVVar12->pArray = ppvVar13;
  p->vPos = pVVar12;
  pVVar12 = (Vec_Ptr_t *)malloc(0x10);
  pVVar12->nCap = 0x200;
  pVVar12->nSize = 0;
  ppvVar13 = (void **)malloc(0x1000);
  pVVar12->pArray = ppvVar13;
  p->vLis = pVVar12;
  pVVar12 = (Vec_Ptr_t *)malloc(0x10);
  pVVar12->nCap = 0x200;
  pVVar12->nSize = 0;
  ppvVar13 = (void **)malloc(0x1000);
  pVVar12->pArray = ppvVar13;
  p->vLos = pVVar12;
  p->pFileName = pFileName;
  pFVar11 = fopen(pFileName,"rb");
  if (pFVar11 == (FILE *)0x0) {
    pcVar15 = "Io_BlifLoadFile(): The file is unavailable (absent or open).";
  }
  else {
    fseek(pFVar11,0,2);
    lVar14 = ftell(pFVar11);
    iVar8 = (int)lVar14;
    if (iVar8 != 0) {
      pcVar15 = (char *)malloc((long)(iVar8 + 10));
      rewind(pFVar11);
      fread(pcVar15,(long)iVar8,1,pFVar11);
      fclose(pFVar11);
      builtin_strncpy(pcVar15 + iVar8,"\n.end\n",7);
      p->pBuffer = pcVar15;
      pVVar12 = p->vLines;
      uVar10 = pVVar12->nSize;
      if (uVar10 == pVVar12->nCap) {
        if ((int)uVar10 < 0x10) {
          if (pVVar12->pArray == (void **)0x0) {
            ppvVar13 = (void **)malloc(0x80);
          }
          else {
            ppvVar13 = (void **)realloc(pVVar12->pArray,0x80);
          }
          pVVar12->pArray = ppvVar13;
          pVVar12->nCap = 0x10;
        }
        else {
          if (pVVar12->pArray == (void **)0x0) {
            ppvVar13 = (void **)malloc((ulong)uVar10 << 4);
          }
          else {
            ppvVar13 = (void **)realloc(pVVar12->pArray,(ulong)uVar10 << 4);
          }
          pVVar12->pArray = ppvVar13;
          pVVar12->nCap = uVar10 * 2;
        }
      }
      else {
        ppvVar13 = pVVar12->pArray;
      }
      iVar8 = pVVar12->nSize;
      pVVar12->nSize = iVar8 + 1;
      ppvVar13[iVar8] = pcVar15;
      bVar5 = false;
      pcVar15 = p->pBuffer;
      do {
        while( true ) {
          pcVar28 = pcVar15 + 1;
          cVar1 = *pcVar15;
          if (cVar1 != '\n') break;
          *pcVar15 = '\0';
          pVVar12 = p->vLines;
          uVar10 = pVVar12->nSize;
          if (uVar10 == pVVar12->nCap) {
            if ((int)uVar10 < 0x10) {
              if (pVVar12->pArray == (void **)0x0) {
                ppvVar13 = (void **)malloc(0x80);
              }
              else {
                ppvVar13 = (void **)realloc(pVVar12->pArray,0x80);
              }
              pVVar12->pArray = ppvVar13;
              pVVar12->nCap = 0x10;
            }
            else {
              if (pVVar12->pArray == (void **)0x0) {
                ppvVar13 = (void **)malloc((ulong)uVar10 << 4);
              }
              else {
                ppvVar13 = (void **)realloc(pVVar12->pArray,(ulong)uVar10 << 4);
              }
              pVVar12->pArray = ppvVar13;
              pVVar12->nCap = uVar10 * 2;
            }
          }
          else {
            ppvVar13 = pVVar12->pArray;
          }
          iVar8 = pVVar12->nSize;
          pVVar12->nSize = iVar8 + 1;
          ppvVar13[iVar8] = pcVar28;
LAB_002d8e01:
          bVar5 = false;
          pcVar15 = pcVar28;
        }
        bVar6 = true;
        if (cVar1 != '#') {
          if (cVar1 == '\0') goto LAB_002d8e0b;
          bVar6 = bVar5;
          if (!bVar5) goto LAB_002d8e01;
        }
        bVar5 = bVar6;
        *pcVar15 = '\0';
        pcVar15 = pcVar28;
      } while( true );
    }
    fclose(pFVar11);
    pcVar15 = "Io_BlifLoadFile(): The file is empty.";
  }
  puts(pcVar15);
  p->pBuffer = (char *)0x0;
  Io_BlifFree(p);
  return (Abc_Ntk_t *)0x0;
LAB_002d8e0b:
  pVVar12 = p->vLines;
  if (0 < pVVar12->nSize) {
    lVar14 = 0;
LAB_002d8e27:
    pbVar31 = (byte *)pVVar12->pArray[lVar14];
    bVar7 = *pbVar31;
    if (bVar7 != 0) {
      for (pbVar25 = pbVar31 + -2; p->pBuffer <= pbVar25; pbVar25 = pbVar25 + -1) {
        bVar29 = *pbVar25;
        if ((0x20 < (ulong)bVar29) || ((0x100002600U >> ((ulong)bVar29 & 0x3f) & 1) == 0))
        goto LAB_002d8e5e;
      }
      bVar29 = *pbVar25;
LAB_002d8e5e:
      if (bVar29 == 0x5c) {
        do {
          *pbVar25 = 0x20;
          pbVar31 = pbVar25 + 1;
          pbVar25 = pbVar25 + 1;
        } while (*pbVar31 != 0);
        *pbVar25 = 0x20;
      }
      else {
        while (pbVar25 = pbVar31 + 1, bVar7 < 0x2f) {
          if ((0x100002600U >> ((ulong)bVar7 & 0x3f) & 1) == 0) {
            if ((ulong)bVar7 != 0x2e) break;
            iVar8 = strncmp((char *)pbVar25,"names",5);
            if (iVar8 == 0) {
              pVVar12 = p->vNames;
            }
            else {
              iVar8 = strncmp((char *)pbVar25,"latch",5);
              if (iVar8 == 0) {
                pVVar12 = p->vLatches;
              }
              else {
                iVar8 = strncmp((char *)pbVar25,"inputs",6);
                if (iVar8 == 0) {
                  pVVar12 = p->vInputs;
                }
                else {
                  iVar8 = strncmp((char *)pbVar25,"outputs",7);
                  if (iVar8 != 0) {
                    iVar8 = strncmp((char *)pbVar25,"model",5);
                    if (iVar8 != 0) {
                      if ((((*pbVar25 == 0x65) && (pbVar31[2] == 0x6e)) && (pbVar31[3] == 100)) ||
                         (iVar8 = strncmp((char *)pbVar25,"exdc",4), iVar8 == 0)) goto LAB_002d906f;
                      sVar23 = strlen((char *)pbVar31);
                      if (pbVar25[sVar23 - 2] == 0xd) {
                        pbVar31[sVar23 - 1] = 0;
                        pVVar12 = p->vLines;
                      }
                      uVar19 = 0xffffffff;
                      if ((long)pVVar12->nSize < 1) goto LAB_002d905c;
                      uVar27 = 0;
                      goto LAB_002d8f98;
                    }
                    p->pModel = (char *)pbVar25;
                    break;
                  }
                  pVVar12 = p->vOutputs;
                }
              }
            }
            uVar10 = pVVar12->nSize;
            if (uVar10 == pVVar12->nCap) {
              if ((int)uVar10 < 0x10) {
                if (pVVar12->pArray == (void **)0x0) {
                  ppvVar13 = (void **)malloc(0x80);
                }
                else {
                  ppvVar13 = (void **)realloc(pVVar12->pArray,0x80);
                }
                pVVar12->pArray = ppvVar13;
                pVVar12->nCap = 0x10;
              }
              else {
                if (pVVar12->pArray == (void **)0x0) {
                  ppvVar13 = (void **)malloc((ulong)uVar10 << 4);
                }
                else {
                  ppvVar13 = (void **)realloc(pVVar12->pArray,(ulong)uVar10 << 4);
                }
                pVVar12->pArray = ppvVar13;
                pVVar12->nCap = uVar10 * 2;
              }
            }
            else {
              ppvVar13 = pVVar12->pArray;
            }
            iVar8 = pVVar12->nSize;
            pVVar12->nSize = iVar8 + 1;
            ppvVar13[iVar8] = pbVar25;
            break;
          }
          pbVar31 = pbVar25;
          bVar7 = *pbVar25;
        }
      }
    }
    goto LAB_002d903e;
  }
LAB_002d906f:
  lVar14 = (long)p->vInputs->nSize;
  if (lVar14 < 1) {
    iVar8 = 0x200;
  }
  else {
    lVar30 = 0;
    iVar8 = 0;
    do {
      pbVar31 = (byte *)p->vInputs->pArray[lVar30];
      bVar7 = 1;
LAB_002d908b:
      uVar19 = (ulong)*pbVar31;
      if (0x20 < uVar19) {
LAB_002d90bc:
        bVar29 = 1;
LAB_002d909e:
        iVar8 = iVar8 + (uint)(bVar7 & (bVar29 ^ 1));
        pbVar31 = pbVar31 + 1;
        bVar7 = bVar29;
        goto LAB_002d908b;
      }
      if ((0x100002600U >> (uVar19 & 0x3f) & 1) != 0) {
        bVar29 = 0;
        goto LAB_002d909e;
      }
      if (uVar19 != 0) goto LAB_002d90bc;
      lVar30 = lVar30 + 1;
    } while (lVar30 != lVar14);
    iVar8 = iVar8 + 0x200;
  }
  iVar8 = iVar8 + p->vLatches->nSize + p->vNames->nSize;
  p->nObjects = iVar8;
  pIVar16 = (Io_BlifObj_t *)calloc(1,(long)iVar8 << 5);
  p->pObjects = pIVar16;
  p->nTableSize = iVar8 / 2 + 1;
  ppIVar17 = (Io_BlifObj_t **)calloc(1,(long)(iVar8 / 2) * 8 + 8);
  p->pTable = ppIVar17;
  Io_BlifSplitIntoTokens(p->vTokens,p->pModel,'\0');
  pVVar12 = p->vTokens;
  uVar10 = pVVar12->nSize;
  if ((int)uVar10 < 1) goto LAB_002d9d87;
  ppvVar13 = pVVar12->pArray;
  pcVar15 = (char *)*ppvVar13;
  iVar8 = strcmp(pcVar15,"model");
  if (iVar8 != 0) {
    __assert_fail("!strcmp(pToken, \"model\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/io/ioReadBlifAig.c"
                  ,0x268,"int Io_BlifParseModel(Io_BlifMan_t *, char *)");
  }
  if (uVar10 == 2) {
    p->pModel = (char *)ppvVar13[1];
    pVVar18 = p->vInputs;
    if (0 < pVVar18->nSize) {
      lVar14 = 0;
      do {
        Io_BlifSplitIntoTokens(pVVar12,(char *)pVVar18->pArray[lVar14],'\0');
        pVVar12 = p->vTokens;
        iVar8 = pVVar12->nSize;
        if (iVar8 < 1) goto LAB_002d9d87;
        iVar9 = strcmp((char *)*pVVar12->pArray,"inputs");
        if (iVar9 != 0) {
          __assert_fail("!strcmp(pToken, \"inputs\")",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/io/ioReadBlifAig.c"
                        ,0x284,"int Io_BlifParseInputs(Io_BlifMan_t *, char *)");
        }
        if (iVar8 != 1) {
          lVar30 = 1;
          do {
            pcVar15 = (char *)pVVar12->pArray[lVar30];
            pIVar16 = Io_BlifHashFindOrAdd(p,pcVar15);
            if ((*(uint *)pIVar16 & 1) != 0) {
              uVar19 = (ulong)p->vLines->nSize;
              uVar27 = 0xffffffff;
              if ((long)uVar19 < 1) goto LAB_002d9a98;
              uVar26 = 0;
              goto LAB_002d9a6f;
            }
            *(uint *)pIVar16 = *(uint *)pIVar16 | 1;
            pVVar12 = p->vPis;
            uVar10 = pVVar12->nSize;
            if (uVar10 == pVVar12->nCap) {
              if ((int)uVar10 < 0x10) {
                if (pVVar12->pArray == (void **)0x0) {
                  ppvVar13 = (void **)malloc(0x80);
                }
                else {
                  ppvVar13 = (void **)realloc(pVVar12->pArray,0x80);
                }
                pVVar12->pArray = ppvVar13;
                pVVar12->nCap = 0x10;
              }
              else {
                if (pVVar12->pArray == (void **)0x0) {
                  ppvVar13 = (void **)malloc((ulong)uVar10 << 4);
                }
                else {
                  ppvVar13 = (void **)realloc(pVVar12->pArray,(ulong)uVar10 << 4);
                }
                pVVar12->pArray = ppvVar13;
                pVVar12->nCap = uVar10 * 2;
              }
            }
            else {
              ppvVar13 = pVVar12->pArray;
            }
            iVar8 = pVVar12->nSize;
            pVVar12->nSize = iVar8 + 1;
            ppvVar13[iVar8] = pIVar16;
            lVar30 = lVar30 + 1;
            pVVar12 = p->vTokens;
          } while (lVar30 < pVVar12->nSize);
        }
        lVar14 = lVar14 + 1;
        pVVar18 = p->vInputs;
      } while (lVar14 < pVVar18->nSize);
    }
    pVVar18 = p->vOutputs;
    if (0 < pVVar18->nSize) {
      lVar14 = 0;
      do {
        Io_BlifSplitIntoTokens(pVVar12,(char *)pVVar18->pArray[lVar14],'\0');
        pVVar12 = p->vTokens;
        iVar8 = pVVar12->nSize;
        if (iVar8 < 1) goto LAB_002d9d87;
        iVar9 = strcmp((char *)*pVVar12->pArray,"outputs");
        if (iVar9 != 0) {
          __assert_fail("!strcmp(pToken, \"outputs\")",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/io/ioReadBlifAig.c"
                        ,0x2a5,"int Io_BlifParseOutputs(Io_BlifMan_t *, char *)");
        }
        if (iVar8 != 1) {
          lVar30 = 1;
          do {
            pcVar15 = (char *)pVVar12->pArray[lVar30];
            pIVar16 = Io_BlifHashFindOrAdd(p,pcVar15);
            uVar10 = *(uint *)pIVar16;
            if ((uVar10 & 2) != 0) {
              uVar19 = (ulong)p->vLines->nSize;
              uVar27 = 0xffffffff;
              if (0 < (long)uVar19) {
                uVar26 = 0;
                do {
                  if (pcVar15 < p->vLines->pArray[uVar26]) {
                    uVar27 = uVar26 & 0xffffffff;
                    break;
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar19 != uVar26);
              }
              fprintf(_stdout,
                      "Line %d: Primary output (%s) is defined more than once (warning only).\n",
                      uVar27,pcVar15);
              uVar10 = *(uint *)pIVar16;
            }
            *(uint *)pIVar16 = uVar10 | 2;
            pVVar12 = p->vPos;
            uVar10 = pVVar12->nSize;
            if (uVar10 == pVVar12->nCap) {
              if ((int)uVar10 < 0x10) {
                if (pVVar12->pArray == (void **)0x0) {
                  ppvVar13 = (void **)malloc(0x80);
                }
                else {
                  ppvVar13 = (void **)realloc(pVVar12->pArray,0x80);
                }
                pVVar12->pArray = ppvVar13;
                pVVar12->nCap = 0x10;
              }
              else {
                if (pVVar12->pArray == (void **)0x0) {
                  ppvVar13 = (void **)malloc((ulong)uVar10 << 4);
                }
                else {
                  ppvVar13 = (void **)realloc(pVVar12->pArray,(ulong)uVar10 << 4);
                }
                pVVar12->pArray = ppvVar13;
                pVVar12->nCap = uVar10 * 2;
              }
            }
            else {
              ppvVar13 = pVVar12->pArray;
            }
            iVar8 = pVVar12->nSize;
            pVVar12->nSize = iVar8 + 1;
            ppvVar13[iVar8] = pIVar16;
            lVar30 = lVar30 + 1;
            pVVar12 = p->vTokens;
          } while (lVar30 < pVVar12->nSize);
        }
        lVar14 = lVar14 + 1;
        pVVar18 = p->vOutputs;
      } while (lVar14 < pVVar18->nSize);
    }
    pVVar12 = p->vLatches;
    if (0 < pVVar12->nSize) {
      lVar14 = 0;
      do {
        Io_BlifSplitIntoTokens(p->vTokens,(char *)pVVar12->pArray[lVar14],'\0');
        uVar10 = p->vTokens->nSize;
        if ((int)uVar10 < 1) goto LAB_002d9d87;
        ppvVar13 = p->vTokens->pArray;
        pcVar28 = (char *)*ppvVar13;
        iVar8 = strcmp(pcVar28,"latch");
        if (iVar8 != 0) {
          __assert_fail("!strcmp(pToken, \"latch\")",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/io/ioReadBlifAig.c"
                        ,0x2c3,"int Io_BlifParseLatch(Io_BlifMan_t *, char *)");
        }
        if (uVar10 < 3) {
          uVar19 = (ulong)p->vLines->nSize;
          uVar27 = 0xffffffff;
          if ((long)uVar19 < 1) goto LAB_002d9cb6;
          uVar26 = 0;
          goto LAB_002d9b40;
        }
        uVar32 = 0xc0;
        if (uVar10 != 3) {
          pcVar15 = (char *)ppvVar13[3];
          uVar10 = atoi(pcVar15);
          if (2 < uVar10) {
            uVar19 = (ulong)p->vLines->nSize;
            uVar27 = 0xffffffff;
            if ((long)uVar19 < 1) goto LAB_002d9d7b;
            uVar26 = 0;
            goto LAB_002d9c9d;
          }
          uVar32 = (uVar10 != 1 | 2) << 6;
          if (uVar10 == 0) {
            uVar32 = 0x40;
          }
        }
        pIVar16 = Io_BlifHashFindOrAdd(p,(char *)ppvVar13[1]);
        *(byte *)pIVar16 = *(byte *)pIVar16 | 4;
        pVVar12 = p->vLis;
        uVar10 = pVVar12->nSize;
        if (uVar10 == pVVar12->nCap) {
          if ((int)uVar10 < 0x10) {
            if (pVVar12->pArray == (void **)0x0) {
              ppvVar13 = (void **)malloc(0x80);
            }
            else {
              ppvVar13 = (void **)realloc(pVVar12->pArray,0x80);
            }
            pVVar12->pArray = ppvVar13;
            pVVar12->nCap = 0x10;
          }
          else {
            if (pVVar12->pArray == (void **)0x0) {
              ppvVar13 = (void **)malloc((ulong)uVar10 << 4);
            }
            else {
              ppvVar13 = (void **)realloc(pVVar12->pArray,(ulong)uVar10 << 4);
            }
            pVVar12->pArray = ppvVar13;
            pVVar12->nCap = uVar10 * 2;
          }
        }
        else {
          ppvVar13 = pVVar12->pArray;
        }
        iVar8 = pVVar12->nSize;
        pVVar12->nSize = iVar8 + 1;
        ppvVar13[iVar8] = pIVar16;
        *(uint *)pIVar16 = *(uint *)pIVar16 & 0xffffff3f | uVar32;
        if (p->vTokens->nSize < 3) goto LAB_002d9d87;
        pIVar16 = Io_BlifHashFindOrAdd(p,(char *)p->vTokens->pArray[2]);
        uVar10 = *(uint *)pIVar16;
        if ((uVar10 & 1) != 0) {
          uVar19 = (ulong)p->vLines->nSize;
          uVar27 = 0xffffffff;
          if ((long)uVar19 < 1) goto LAB_002d9cfd;
          uVar26 = 0;
          goto LAB_002d9b78;
        }
        if ((uVar10 & 8) != 0) {
          uVar19 = (ulong)p->vLines->nSize;
          uVar27 = 0xffffffff;
          if ((long)uVar19 < 1) goto LAB_002d9d24;
          uVar26 = 0;
          goto LAB_002d9bb0;
        }
        *(uint *)pIVar16 = uVar10 | 8;
        pVVar12 = p->vLos;
        uVar10 = pVVar12->nSize;
        if (uVar10 == pVVar12->nCap) {
          if ((int)uVar10 < 0x10) {
            if (pVVar12->pArray == (void **)0x0) {
              ppvVar13 = (void **)malloc(0x80);
            }
            else {
              ppvVar13 = (void **)realloc(pVVar12->pArray,0x80);
            }
            pVVar12->pArray = ppvVar13;
            pVVar12->nCap = 0x10;
          }
          else {
            if (pVVar12->pArray == (void **)0x0) {
              ppvVar13 = (void **)malloc((ulong)uVar10 << 4);
            }
            else {
              ppvVar13 = (void **)realloc(pVVar12->pArray,(ulong)uVar10 << 4);
            }
            pVVar12->pArray = ppvVar13;
            pVVar12->nCap = uVar10 * 2;
          }
        }
        else {
          ppvVar13 = pVVar12->pArray;
        }
        iVar8 = pVVar12->nSize;
        pVVar12->nSize = iVar8 + 1;
        ppvVar13[iVar8] = pIVar16;
        *(uint *)pIVar16 = *(uint *)pIVar16 & 0xffffff3f | uVar32;
        lVar14 = lVar14 + 1;
        pVVar12 = p->vLatches;
      } while (lVar14 < pVVar12->nSize);
    }
    pVVar12 = p->vNames;
    if (0 < pVVar12->nSize) {
      lVar14 = 0;
      do {
        Io_BlifSplitIntoTokens(p->vTokens,(char *)pVVar12->pArray[lVar14],'\0');
        lVar30 = (long)p->vTokens->nSize;
        if (lVar30 < 1) goto LAB_002d9d87;
        ppvVar13 = p->vTokens->pArray;
        iVar8 = strcmp((char *)*ppvVar13,"names");
        if (iVar8 != 0) {
          __assert_fail("!strcmp((char *)Vec_PtrEntry(p->vTokens,0), \"names\")",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/io/ioReadBlifAig.c"
                        ,0x300,"int Io_BlifParseNames(Io_BlifMan_t *, char *)");
        }
        pcVar15 = (char *)ppvVar13[lVar30 + -1];
        pIVar16 = Io_BlifHashFindOrAdd(p,pcVar15);
        uVar10 = *(uint *)pIVar16;
        if ((uVar10 & 1) != 0) {
          uVar19 = (ulong)p->vLines->nSize;
          uVar27 = 0xffffffff;
          if ((long)uVar19 < 1) goto LAB_002d9d51;
          uVar26 = 0;
          goto LAB_002d9bea;
        }
        if ((uVar10 & 8) != 0) {
          uVar19 = (ulong)p->vLines->nSize;
          uVar27 = 0xffffffff;
          if ((long)uVar19 < 1) goto LAB_002d9d5c;
          uVar26 = 0;
          goto LAB_002d9c24;
        }
        if ((uVar10 & 0x10) != 0) {
          uVar19 = (ulong)p->vLines->nSize;
          uVar27 = 0xffffffff;
          if ((long)uVar19 < 1) goto LAB_002d9d67;
          uVar26 = 0;
          goto LAB_002d9c5e;
        }
        *(uint *)pIVar16 = uVar10 | 0x10;
        pIVar16->pName = pcVar15;
        if (p->vTokens->nSize < 2) goto LAB_002d9d87;
        *(uint *)pIVar16 =
             uVar10 & 0xf6 | 0x10 | ((int)pcVar15 - *(int *)(p->vTokens->pArray + 1)) * 0x100;
        lVar14 = lVar14 + 1;
        pVVar12 = p->vNames;
      } while (lVar14 < pVVar12->nSize);
    }
    pAVar20 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    p->pAig = pAVar20;
    pcVar15 = Extra_UtilStrsav(p->pModel);
    pAVar20->pName = pcVar15;
    pcVar15 = Extra_UtilStrsav(p->pFileName);
    pAVar20->pSpec = pcVar15;
    pVVar12 = p->vPis;
    if (0 < pVVar12->nSize) {
      lVar14 = 0;
      do {
        pvVar2 = pVVar12->pArray[lVar14];
        pAVar21 = Abc_NtkCreateObj(pAVar20,ABC_OBJ_PI);
        Abc_ObjAssignName(pAVar21,*(char **)((long)pvVar2 + 8),(char *)0x0);
        *(Abc_Obj_t **)((long)pvVar2 + 0x10) = pAVar21;
        lVar14 = lVar14 + 1;
        pVVar12 = p->vPis;
      } while (lVar14 < pVVar12->nSize);
    }
    pVVar12 = p->vPos;
    if (0 < pVVar12->nSize) {
      lVar14 = 0;
      do {
        pvVar2 = pVVar12->pArray[lVar14];
        pAVar21 = Abc_NtkCreateObj(pAVar20,ABC_OBJ_PO);
        Abc_ObjAssignName(pAVar21,*(char **)((long)pvVar2 + 8),(char *)0x0);
        lVar14 = lVar14 + 1;
        pVVar12 = p->vPos;
      } while (lVar14 < pVVar12->nSize);
    }
    pVVar18 = p->vLos;
    if (0 < pVVar18->nSize) {
      lVar14 = 0;
      do {
        puVar3 = (uint *)pVVar18->pArray[lVar14];
        pAVar21 = Abc_NtkCreateObj(pAVar20,ABC_OBJ_BI);
        if (p->vLis->nSize <= lVar14) goto LAB_002d9d87;
        Abc_ObjAssignName(pAVar21,*(char **)((long)p->vLis->pArray[lVar14] + 8),(char *)0x0);
        pObj = Abc_NtkCreateObj(pAVar20,ABC_OBJ_LATCH);
        aVar22._0_4_ = *puVar3 >> 6 & 3;
        aVar22._4_4_ = 0;
        pObj->field_5 = aVar22;
        Abc_ObjAssignName(pObj,*(char **)(puVar3 + 2),"L");
        Abc_ObjAddFanin(pObj,pAVar21);
        pAVar21 = Abc_NtkCreateObj(pAVar20,ABC_OBJ_BO);
        Abc_ObjAssignName(pAVar21,*(char **)(puVar3 + 2),(char *)0x0);
        Abc_ObjAddFanin(pAVar21,pObj);
        *(Abc_Obj_t **)(puVar3 + 4) = pAVar21;
        lVar14 = lVar14 + 1;
        pVVar18 = p->vLos;
      } while (lVar14 < pVVar18->nSize);
      pVVar12 = p->vPos;
    }
    if (0 < pVVar12->nSize) {
      pAVar20 = (Abc_Ntk_t *)0x0;
      lVar14 = 0;
      do {
        pAVar21 = Io_BlifParseConstruct_rec(p,*(char **)((long)pVVar12->pArray[lVar14] + 8));
        if (pAVar21 == (Abc_Obj_t *)0x0) goto LAB_002d9aac;
        pVVar12 = p->pAig->vPos;
        if (pVVar12->nSize <= lVar14) goto LAB_002d9d87;
        Abc_ObjAddFanin((Abc_Obj_t *)pVVar12->pArray[lVar14],pAVar21);
        lVar14 = lVar14 + 1;
        pVVar12 = p->vPos;
      } while (lVar14 < pVVar12->nSize);
    }
    pVVar12 = p->vLis;
    if (0 < pVVar12->nSize) {
      pAVar20 = (Abc_Ntk_t *)0x0;
      lVar14 = 0;
      do {
        pAVar21 = Io_BlifParseConstruct_rec(p,*(char **)((long)pVVar12->pArray[lVar14] + 8));
        if (pAVar21 == (Abc_Obj_t *)0x0) goto LAB_002d9aac;
        pVVar12 = p->pAig->vBoxes;
        if (pVVar12->nSize <= lVar14) goto LAB_002d9d87;
        plVar4 = (long *)pVVar12->pArray[lVar14];
        Abc_ObjAddFanin(*(Abc_Obj_t **)
                         (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8),
                        pAVar21);
        lVar14 = lVar14 + 1;
        pVVar12 = p->vLis;
      } while (lVar14 < pVVar12->nSize);
    }
    iVar8 = p->vNames->nSize - p->nTablesRead;
    p->nTablesLeft = iVar8;
    if (iVar8 != 0) {
      printf("The number of dangling tables = %d.\n");
    }
    iVar8 = p->pAig->nObjCounts[7];
    iVar9 = p->iObjNext;
    if (0 < (long)iVar9) {
      pIVar16 = p->pObjects;
      lVar14 = 0;
      uVar10 = 0;
LAB_002d99ce:
      if ((undefined1  [32])((undefined1  [32])pIVar16[lVar14] & (undefined1  [32])0x10) !=
          (undefined1  [32])0x0) {
        pcVar15 = pIVar16[lVar14].pName;
        sVar23 = strlen(pcVar15);
        pbVar31 = (byte *)(pcVar15 + sVar23);
        iVar24 = 0;
        do {
          if (*pbVar31 - 0x30 < 2) {
            iVar24 = iVar24 + 1;
          }
          else if (*pbVar31 == 0x2e) goto LAB_002d9a0a;
          pbVar31 = pbVar31 + 1;
        } while( true );
      }
      goto LAB_002d9a14;
    }
    uVar10 = 0;
LAB_002d9ccf:
    printf("AND nodes = %6d.  Estimate = %6d.\n",iVar8,(ulong)uVar10);
    pAVar20 = p->pAig;
    p->pAig = (Abc_Ntk_t *)0x0;
  }
  else {
    uVar19 = (ulong)p->vLines->nSize;
    uVar27 = 0xffffffff;
    if (0 < (long)uVar19) {
      uVar26 = 0;
      do {
        if (pcVar15 < p->vLines->pArray[uVar26]) {
          uVar27 = uVar26 & 0xffffffff;
          break;
        }
        uVar26 = uVar26 + 1;
      } while (uVar19 != uVar26);
    }
    pAVar20 = (Abc_Ntk_t *)0x0;
    sprintf(p->sError,"Line %d: Model line has %d entries while it should have 2.",uVar27,
            (ulong)uVar10);
  }
  goto LAB_002d9aac;
  while (uVar27 = uVar27 + 1, (long)pVVar12->nSize != uVar27) {
LAB_002d8f98:
    if (pbVar31 < pVVar12->pArray[uVar27]) {
      uVar19 = uVar27 & 0xffffffff;
      break;
    }
  }
LAB_002d905c:
  fprintf(_stdout,"Line %d: Skipping line \"%s\".\n",uVar19,pbVar31);
LAB_002d903e:
  lVar14 = lVar14 + 1;
  pVVar12 = p->vLines;
  if (pVVar12->nSize <= lVar14) goto LAB_002d906f;
  goto LAB_002d8e27;
  while (uVar26 = uVar26 + 1, uVar19 != uVar26) {
LAB_002d9a6f:
    if (pcVar15 < p->vLines->pArray[uVar26]) {
      uVar27 = uVar26 & 0xffffffff;
      break;
    }
  }
LAB_002d9a98:
  pcVar28 = "Line %d: Primary input (%s) is defined more than once.";
  goto LAB_002d9aa5;
  while (uVar26 = uVar26 + 1, uVar19 != uVar26) {
LAB_002d9b40:
    if (pcVar28 < p->vLines->pArray[uVar26]) {
      uVar27 = uVar26 & 0xffffffff;
      break;
    }
  }
LAB_002d9cb6:
  pAVar20 = (Abc_Ntk_t *)0x0;
  sprintf(p->sError,"Line %d: Latch does not have input name and output name.",uVar27);
  goto LAB_002d9aac;
  while (uVar26 = uVar26 + 1, uVar19 != uVar26) {
LAB_002d9c9d:
    if (pcVar28 < p->vLines->pArray[uVar26]) {
      uVar27 = uVar26 & 0xffffffff;
      break;
    }
  }
LAB_002d9d7b:
  pcVar28 = "Line %d: Initial state of the latch is incorrect (%s).";
  goto LAB_002d9aa5;
  while (uVar26 = uVar26 + 1, uVar19 != uVar26) {
LAB_002d9b78:
    if (pcVar28 < p->vLines->pArray[uVar26]) {
      uVar27 = uVar26 & 0xffffffff;
      break;
    }
  }
LAB_002d9cfd:
  if (p->vTokens->nSize < 3) goto LAB_002d9d87;
  pcVar15 = (char *)p->vTokens->pArray[2];
  pcVar28 = "Line %d: Primary input (%s) is also defined latch output.";
  goto LAB_002d9aa5;
  while (uVar26 = uVar26 + 1, uVar19 != uVar26) {
LAB_002d9bb0:
    if (pcVar28 < p->vLines->pArray[uVar26]) {
      uVar27 = uVar26 & 0xffffffff;
      break;
    }
  }
LAB_002d9d24:
  if (p->vTokens->nSize < 3) {
LAB_002d9d87:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pcVar15 = (char *)p->vTokens->pArray[2];
  pcVar28 = "Line %d: Latch output (%s) is defined as the output of another latch.";
  goto LAB_002d9aa5;
  while (uVar26 = uVar26 + 1, uVar19 != uVar26) {
LAB_002d9bea:
    if (pcVar15 < p->vLines->pArray[uVar26]) {
      uVar27 = uVar26 & 0xffffffff;
      break;
    }
  }
LAB_002d9d51:
  pcVar28 = "Line %d: Primary input (%s) has a table.";
  goto LAB_002d9aa5;
  while (uVar26 = uVar26 + 1, uVar19 != uVar26) {
LAB_002d9c24:
    if (pcVar15 < p->vLines->pArray[uVar26]) {
      uVar27 = uVar26 & 0xffffffff;
      break;
    }
  }
LAB_002d9d5c:
  pcVar28 = "Line %d: Latch output (%s) has a table.";
  goto LAB_002d9aa5;
LAB_002d9a0a:
  if (iVar24 != 0) {
    uVar10 = (uVar10 + iVar24) - 1;
  }
LAB_002d9a14:
  lVar14 = lVar14 + 1;
  if (lVar14 == iVar9) goto LAB_002d9ccf;
  goto LAB_002d99ce;
  while (uVar26 = uVar26 + 1, uVar19 != uVar26) {
LAB_002d9c5e:
    if (pcVar15 < p->vLines->pArray[uVar26]) {
      uVar27 = uVar26 & 0xffffffff;
      break;
    }
  }
LAB_002d9d67:
  pcVar28 = "Line %d: Signal (%s) is defined more than once.";
LAB_002d9aa5:
  pAVar20 = (Abc_Ntk_t *)0x0;
  sprintf(p->sError,pcVar28,uVar27,pcVar15);
LAB_002d9aac:
  if (p->sError[0] != '\0') {
    fprintf(_stdout,"%s\n",p->sError);
  }
  if (pAVar20 != (Abc_Ntk_t *)0x0) {
    Io_BlifFree(p);
    if (fCheck == 0) {
      return pAVar20;
    }
    iVar8 = Abc_NtkCheckRead(pAVar20);
    if (iVar8 != 0) {
      return pAVar20;
    }
    puts("Io_Blif: The network check has failed.");
    Abc_NtkDelete(pAVar20);
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Io_ReadBlifAsAig( char * pFileName, int fCheck )
{
    FILE * pFile;
    Io_BlifMan_t * p;
    Abc_Ntk_t * pAig;

    // check that the file is available
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Io_Blif(): The file is unavailable (absent or open).\n" );
        return 0;
    }
    fclose( pFile );

    // start the file reader
    p = Io_BlifAlloc();
    p->pFileName = pFileName;
    p->pBuffer   = Io_BlifLoadFile( pFileName );
    if ( p->pBuffer == NULL )
    {
        Io_BlifFree( p );
        return NULL;
    }
    // prepare the file for parsing
    Io_BlifReadPreparse( p );
    // construct the network
    pAig = Io_BlifParse( p );
    if ( p->sError[0] )
        fprintf( stdout, "%s\n", p->sError );
    if ( pAig == NULL )
        return NULL;
    Io_BlifFree( p );

    // make sure that everything is okay with the network structure
    if ( fCheck && !Abc_NtkCheckRead( pAig ) )
    {
        printf( "Io_Blif: The network check has failed.\n" );
        Abc_NtkDelete( pAig );
        return NULL;
    }
    return pAig;
}